

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

char * sexp_find_module_file_raw(sexp ctx,char *file)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  stat *buf;
  stat buf_str;
  sexp_uint_t len;
  sexp_uint_t filelen;
  sexp_uint_t dirlen;
  sexp_uint_t slash;
  char *path;
  char *dir;
  sexp ls;
  stat local_e0;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  long local_38;
  char *local_30;
  void *local_28;
  int *local_20;
  char *local_18;
  long local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = strlen(in_RSI);
  local_20 = *(int **)(*(long *)(local_10 + 0x28) + 0x70);
  while( true ) {
    bVar2 = false;
    if (((ulong)local_20 & 3) == 0) {
      bVar2 = *local_20 == 6;
    }
    if (!bVar2) {
      return (char *)0x0;
    }
    local_28 = (void *)(*(long *)(*(long *)(local_20 + 2) + 8) + 0x10 +
                       *(long *)(*(long *)(local_20 + 2) + 0x10));
    local_40 = *(size_t *)(*(long *)(local_20 + 2) + 0x18);
    local_38 = (long)(int)(uint)(*(char *)((long)local_28 + (local_40 - 1)) == '/');
    local_50 = (local_40 + local_48 + 2) - local_38;
    local_30 = (char *)malloc(local_50);
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
    memcpy(local_30,local_28,local_40);
    if (local_38 == 0) {
      local_30[local_40] = '/';
    }
    memcpy(local_30 + (local_50 - local_48) + -1,local_18,local_48);
    local_30[local_50 - 1] = '\0';
    iVar1 = stat(local_30,&local_e0);
    if (iVar1 == 0) break;
    free(local_30);
    local_20 = *(int **)(local_20 + 4);
  }
  return local_30;
}

Assistant:

char* sexp_find_module_file_raw (sexp ctx, const char *file) {
  sexp ls;
  char *dir, *path;
  sexp_uint_t slash, dirlen, filelen, len;
#ifdef PLAN9
#define file_exists_p(path, buf) (stat(path, buf, 128) >= 0)
  unsigned char buf[128];
#else
#define file_exists_p(path, buf) (! stat(path, buf))
  struct stat buf_str;
  struct stat *buf = &buf_str;
#endif

  filelen = strlen(file);

  ls = sexp_global(ctx, SEXP_G_MODULE_PATH);
  for ( ; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    dir = sexp_string_data(sexp_car(ls));
    dirlen = sexp_string_size(sexp_car(ls));
    slash = dir[dirlen-1] == '/';
    len = dirlen+filelen+2-slash;
    path = (char*) sexp_malloc(len);
    if (! path) return NULL;
    memcpy(path, dir, dirlen);
    if (! slash) path[dirlen] = '/';
    memcpy(path+len-filelen-1, file, filelen);
    path[len-1] = '\0';
    if (sexp_find_static_library(path) || file_exists_p(path, buf))
      return path;
    free(path);
  }

  return NULL;
}